

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.h
# Opt level: O0

int64_t __thiscall ArgParser::ArgIterator::getint(ArgIterator *this)

{
  logic_error *this_00;
  pair<long,_const_char_*> pVar1;
  int64_t local_20;
  pair<long,_const_char_*> res;
  ArgIterator *this_local;
  
  getstr(this);
  pVar1 = parsesigned<char_const*>(this->p,this->pend,0);
  res.first = (long)pVar1.second;
  if ((char *)res.first != this->pend) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"characters trailing number");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  local_20 = pVar1.first;
  return local_20;
}

Assistant:

int64_t getint()
        {
            getstr(); // ignoring result, we use 'p' directly.

            auto res = parsesigned(p, pend, 0);
            if (res.second != pend)
                throw std::logic_error("characters trailing number");
            return res.first;
        }